

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O2

shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>
chaiscript::detail::
Cast_Helper_Inner<std::shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  Any *this;
  Type_Conversions *pTVar1;
  __shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
  *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> sVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  pTVar1 = (param_2->m_conversions)._M_data;
  this = (Any *)((long)&(pTVar1->m_mutex)._M_impl._M_rwlock + 0x18);
  if (((pTVar1->m_mutex)._M_impl._M_rwlock.__size[0x10] & 1U) == 0) {
    Any::cast<std::shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function>>(this);
    sVar4 = std::
            const_pointer_cast<chaiscript::dispatch::Assignable_Proxy_Function_const,chaiscript::dispatch::Assignable_Proxy_Function>
                      ((shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function> *)ob);
    _Var3 = sVar4.
            super___shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  }
  else {
    p_Var2 = &Any::cast<std::shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function_const>>
                        (this)->
              super___shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
    ;
    std::
    __shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                    *)ob,p_Var2);
    _Var3._M_pi = extraout_RDX;
  }
  sVar4.
  super___shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  sVar4.
  super___shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)ob;
  return (shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>)
         sVar4.
         super___shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static auto cast(const Boxed_Value &ob, const Type_Conversions_State *) {
        if (!ob.get_type_info().is_const()) {
          return std::const_pointer_cast<const Result>(ob.get().cast<std::shared_ptr<Result>>());
        } else {
          return ob.get().cast<std::shared_ptr<const Result>>();
        }
      }